

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_url_tests.cpp
# Opt level: O1

void __thiscall
common_url_tests::decode_internal_nulls_test::test_method(decode_internal_nulls_test *this)

{
  long lVar1;
  size_t __n;
  int iVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  bool bVar5;
  const_string file;
  string_view url_encoded;
  const_string file_00;
  string_view url_encoded_00;
  const_string msg;
  const_string msg_00;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  string *local_130;
  undefined **local_128;
  undefined1 local_120;
  undefined1 *local_118;
  string **local_110;
  string *local_108;
  undefined **local_100;
  undefined1 local_f8;
  undefined1 *local_f0;
  string **local_e8;
  string *local_e0;
  char *local_d8;
  assertion_result local_d0;
  string local_b8;
  undefined1 local_98 [8];
  bool local_90;
  undefined7 uStack_8f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string result2;
  string result1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  result1._M_dataplus._M_p = (pointer)&result1.field_2;
  result1.field_2._M_allocated_capacity._0_4_ = 0x780000;
  result1.field_2._M_allocated_capacity._4_2_ = 0;
  result1._M_string_length = 5;
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x46;
  file.m_begin = (iterator)&local_140;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_150,msg);
  result2._M_string_length = result2._M_string_length & 0xffffffffffffff00;
  result2._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_013d3cb0;
  result2.field_2._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  result2.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  url_encoded._M_str = "%00%00x%00%00";
  url_encoded._M_len = 0xd;
  UrlDecode_abi_cxx11_((string *)local_98,url_encoded);
  __n = CONCAT71(uStack_8f,local_90);
  if (__n == result1._M_string_length) {
    if (__n == 0) {
      local_b8._M_dataplus._M_p._0_1_ = true;
    }
    else {
      iVar2 = bcmp((void *)local_98,result1._M_dataplus._M_p,__n);
      local_b8._M_dataplus._M_p._0_1_ = iVar2 == 0;
    }
  }
  else {
    local_b8._M_dataplus._M_p._0_1_ = false;
  }
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_d0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_d0.m_message.px = (element_type *)0xe99fda;
  local_e8 = &local_e0;
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_013d3d70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_108 = &result1;
  local_110 = &local_108;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_013d3d70;
  local_118 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_e0 = (string *)local_98;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_b8,(lazy_ostream *)&result2,1,2,REQUIRE,0xe9a5e2,
             (size_t)&local_d0,0x46,&local_100,"result1",&local_128);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_b8.field_2._M_allocated_capacity);
  if (local_98 != (undefined1  [8])&local_88) {
    operator_delete((void *)local_98,local_88._M_allocated_capacity + 1);
  }
  result2.field_2._M_allocated_capacity._0_6_ = 0x636261;
  result2._M_string_length = 5;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/common_url_tests.cpp"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x48;
  file_00.m_begin = (iterator)&local_160;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  result2._M_dataplus._M_p = (pointer)&result2.field_2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_170,
             msg_00);
  local_90 = false;
  local_98 = (undefined1  [8])&PTR__lazy_ostream_013d3cb0;
  local_88._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_88._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  url_encoded_00._M_str = "abc%00%00";
  url_encoded_00._M_len = 9;
  UrlDecode_abi_cxx11_(&local_b8,url_encoded_00);
  if (local_b8._M_string_length == result2._M_string_length) {
    if (local_b8._M_string_length == 0) {
      bVar5 = true;
    }
    else {
      iVar2 = bcmp((void *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_)
                   ,result2._M_dataplus._M_p,local_b8._M_string_length);
      bVar5 = iVar2 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  local_d0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar5;
  local_d0.m_message.px = (element_type *)0x0;
  local_d0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e0 = (string *)0xe99f78;
  local_d8 = "";
  local_f8 = 0;
  local_100 = &PTR__lazy_ostream_013d3d70;
  local_f0 = boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_108;
  local_110 = &local_130;
  local_130 = &result2;
  local_120 = 0;
  local_128 = &PTR__lazy_ostream_013d3d70;
  local_118 = boost::unit_test::lazy_ostream::inst;
  local_108 = &local_b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_d0,(lazy_ostream *)local_98,1,2,REQUIRE,0xe9a60f,(size_t)&local_e0,0x48,
             &local_100,"result2",&local_128);
  boost::detail::shared_count::~shared_count(&local_d0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_) !=
      &local_b8.field_2) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_),
                    local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result2._M_dataplus._M_p != &result2.field_2) {
    operator_delete(result2._M_dataplus._M_p,result2.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result1._M_dataplus._M_p != &result1.field_2) {
    operator_delete(result1._M_dataplus._M_p,
                    CONCAT26(result1.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(result1.field_2._M_allocated_capacity._4_2_,
                                      result1.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(decode_internal_nulls_test) {
    std::string result1{"\0\0x\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("%00%00x%00%00"), result1);
    std::string result2{"abc\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("abc%00%00"), result2);
}